

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  _Bool _Var1;
  Curl_easy *pCVar2;
  undefined4 *puVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  
  *done = false;
  pCVar2 = conn->data;
  CVar4 = Curl_urldecode(pCVar2,(pCVar2->state).up.path + 1,0,
                         (char **)((long)(pCVar2->req).protop + 8),(size_t *)0x0,true);
  if (CVar4 == CURLE_OK) {
    pCVar2 = conn->data;
    pcVar5 = (pCVar2->set).str[6];
    CVar4 = CURLE_OK;
    if (pcVar5 != (char *)0x0) {
      CVar4 = Curl_urldecode(pCVar2,pcVar5,0,(char **)((long)(pCVar2->req).protop + 0x10),
                             (size_t *)0x0,true);
    }
    if (CVar4 == CURLE_OK) {
      pCVar2 = conn->data;
      (pCVar2->req).size = -1;
      Curl_pgrsSetUploadCounter(pCVar2,0);
      Curl_pgrsSetDownloadCounter(pCVar2,0);
      Curl_pgrsSetUploadSize(pCVar2,-1);
      Curl_pgrsSetDownloadSize(pCVar2,-1);
      pCVar2 = conn->data;
      if ((pCVar2->set).opt_no_body == true) {
        *(undefined4 *)(pCVar2->req).protop = 1;
      }
      *done = false;
      puVar3 = (undefined4 *)(pCVar2->req).protop;
      if (**(char **)(puVar3 + 2) == '\0') {
        pcVar5 = "LIST";
      }
      else {
        _Var1 = (pCVar2->set).ftp_list_only;
        pcVar5 = "RETR";
        if (_Var1 != false) {
          pcVar5 = "LIST";
        }
        if (_Var1 == true) {
          *puVar3 = 1;
          pcVar5 = "LIST";
        }
      }
      pcVar6 = *(char **)(puVar3 + 4);
      if (**(char **)(puVar3 + 2) == '\0') {
        if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
          pcVar6 = pcVar5;
        }
        CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar6);
      }
      else {
        if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
          pcVar6 = pcVar5;
        }
        CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",pcVar6);
      }
      if (CVar4 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_FETCH;
        CVar4 = pop3_multi_statemach(conn,done);
        return CVar4;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(conn);
  if(result)
    return result;

  result = pop3_regular_transfer(conn, done);

  return result;
}